

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

void __thiscall
Jupiter::IRC::Client::Channel::delUserPrefix(Channel *this,string_view in_nickname,char prefix)

{
  pointer __s;
  void *pvVar1;
  size_type __pos;
  string_view in_nickname_00;
  shared_ptr<Jupiter::IRC::Client::Channel::User> user;
  _Alloc_hider local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  in_nickname_00._M_str = (char *)in_nickname._M_len;
  in_nickname_00._M_len = (size_t)this;
  getUser((Channel *)&stack0xffffffffffffffd8,in_nickname_00);
  if (local_28._M_p != (pointer)0x0) {
    if (*(size_t *)(local_28._M_p + 0x18) == 0) {
      __pos = 0xffffffffffffffff;
    }
    else {
      __s = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_28._M_p + 0x10))->_M_dataplus)._M_p;
      pvVar1 = memchr(__s,(int)prefix,*(size_t *)(local_28._M_p + 0x18));
      __pos = -(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)__s;
    }
    if (__pos != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_28._M_p + 0x10),__pos,1);
    }
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    return;
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::Channel::delUserPrefix(std::string_view in_nickname, char prefix) {
	auto user = getUser(in_nickname);

	if (user != nullptr) {
		size_t prefix_pos = user->m_prefixes.find(prefix);
		if (prefix_pos != std::string::npos) {
			user->m_prefixes.erase(prefix_pos, 1);
		}
	}
}